

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

void __thiscall
Darts::Details::DoubleArrayBuilder::build_from_dawg
          (DoubleArrayBuilder *this,DawgBuilder *dawg,id_type dawg_id,id_type dic_id)

{
  bool bVar1;
  byte bVar2;
  uint offset_00;
  id_type iVar3;
  id_type iVar4;
  DoubleArrayBuilderUnit *pDVar5;
  uint *puVar6;
  id_type dic_child_id;
  uchar_type child_label;
  id_type offset;
  id_type offset_1;
  id_type intersection_id;
  id_type dawg_child_id;
  id_type dic_id_local;
  id_type dawg_id_local;
  DawgBuilder *dawg_local;
  DoubleArrayBuilder *this_local;
  
  offset_1 = DawgBuilder::child(dawg,dawg_id);
  bVar1 = DawgBuilder::is_intersection(dawg,offset_1);
  if (bVar1) {
    iVar3 = DawgBuilder::intersection_id(dawg,offset_1);
    puVar6 = AutoArray<unsigned_int>::operator[](&this->table_,(ulong)iVar3);
    if ((*puVar6 != 0) &&
       ((offset_00 = dic_id ^ *puVar6, (offset_00 & 0x1fe00000) == 0 || ((offset_00 & 0xff) == 0))))
    {
      bVar1 = DawgBuilder::is_leaf(dawg,offset_1);
      if (bVar1) {
        pDVar5 = AutoPool<Darts::Details::DoubleArrayBuilderUnit>::operator[]
                           (&this->units_,(ulong)dic_id);
        DoubleArrayBuilderUnit::set_has_leaf(pDVar5,true);
      }
      pDVar5 = AutoPool<Darts::Details::DoubleArrayBuilderUnit>::operator[]
                         (&this->units_,(ulong)dic_id);
      DoubleArrayBuilderUnit::set_offset(pDVar5,offset_00);
      return;
    }
  }
  iVar3 = arrange_from_dawg(this,dawg,dawg_id,dic_id);
  bVar1 = DawgBuilder::is_intersection(dawg,offset_1);
  if (bVar1) {
    iVar4 = DawgBuilder::intersection_id(dawg,offset_1);
    puVar6 = AutoArray<unsigned_int>::operator[](&this->table_,(ulong)iVar4);
    *puVar6 = iVar3;
  }
  do {
    bVar2 = DawgBuilder::label(dawg,offset_1);
    if (bVar2 != 0) {
      build_from_dawg(this,dawg,offset_1,iVar3 ^ bVar2);
    }
    offset_1 = DawgBuilder::sibling(dawg,offset_1);
  } while (offset_1 != 0);
  return;
}

Assistant:

inline void DoubleArrayBuilder::build_from_dawg(const DawgBuilder &dawg,
    id_type dawg_id, id_type dic_id) {
  id_type dawg_child_id = dawg.child(dawg_id);
  if (dawg.is_intersection(dawg_child_id)) {
    id_type intersection_id = dawg.intersection_id(dawg_child_id);
    id_type offset = table_[intersection_id];
    if (offset != 0) {
      offset ^= dic_id;
      if (!(offset & UPPER_MASK) || !(offset & LOWER_MASK)) {
        if (dawg.is_leaf(dawg_child_id)) {
          units_[dic_id].set_has_leaf(true);
        }
        units_[dic_id].set_offset(offset);
        return;
      }
    }
  }

  id_type offset = arrange_from_dawg(dawg, dawg_id, dic_id);
  if (dawg.is_intersection(dawg_child_id)) {
    table_[dawg.intersection_id(dawg_child_id)] = offset;
  }

  do {
    uchar_type child_label = dawg.label(dawg_child_id);
    id_type dic_child_id = offset ^ child_label;
    if (child_label != '\0') {
      build_from_dawg(dawg, dawg_child_id, dic_child_id);
    }
    dawg_child_id = dawg.sibling(dawg_child_id);
  } while (dawg_child_id != 0);
}